

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O2

void __thiscall
DLoadSaveMenu::DLoadSaveMenu(DLoadSaveMenu *this,DMenu *parent,FListMenuDescriptor *desc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  DFrameBuffer *pDVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  DListMenu::DListMenu(&this->super_DListMenu,parent,desc);
  (this->super_DListMenu).super_DMenu.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_007bf708;
  ReadSaveStrings();
  this->savepicLeft = 10;
  iVar3 = CleanYfac;
  iVar8 = CleanYfac * 0x36;
  this->savepicTop = iVar8;
  pDVar4 = screen;
  iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  iVar5 = (iVar1 * 0xd8) / 0x280;
  this->savepicWidth = iVar5;
  iVar2 = (pDVar4->super_DSimpleCanvas).super_DCanvas.Height;
  iVar6 = (iVar2 * 0x87) / 400;
  this->savepicHeight = iVar6;
  iVar9 = (SmallFont->FontHeight + 1) * iVar3;
  this->rowHeight = iVar9;
  this->listboxLeft = iVar5 + 0x18;
  this->listboxTop = iVar8;
  this->listboxWidth = (iVar1 - iVar5) + -0x22;
  iVar7 = (iVar2 + iVar3 * -0x36 + -0xb) / iVar9;
  this->listboxRows = iVar7;
  iVar9 = iVar9 * iVar7;
  this->listboxHeight = iVar9 + 1;
  this->listboxRight = iVar1 + -10;
  this->listboxBottom = iVar9 + iVar8 + 1;
  this->commentLeft = 10;
  this->commentTop = iVar8 + iVar6 + 0x10;
  this->commentWidth = iVar5;
  iVar1 = 0x33;
  if (200 < iVar2) {
    iVar1 = 0x3d;
  }
  this->commentHeight = iVar1 * iVar3;
  this->commentRight = iVar5 + 10;
  this->commentBottom = iVar1 * iVar3 + iVar8 + iVar6 + 0x10;
  return;
}

Assistant:

DLoadSaveMenu::DLoadSaveMenu(DMenu *parent, FListMenuDescriptor *desc)
: DListMenu(parent, desc)
{
	ReadSaveStrings();

	savepicLeft = 10;
	savepicTop = 54*CleanYfac;
	savepicWidth = 216*screen->GetWidth()/640;
	savepicHeight = 135*screen->GetHeight()/400;

	rowHeight = (SmallFont->GetHeight() + 1) * CleanYfac;
	listboxLeft = savepicLeft + savepicWidth + 14;
	listboxTop = savepicTop;
	listboxWidth = screen->GetWidth() - listboxLeft - 10;
	int listboxHeight1 = screen->GetHeight() - listboxTop - 10;
	listboxRows = (listboxHeight1 - 1) / rowHeight;
	listboxHeight = listboxRows * rowHeight + 1;
	listboxRight = listboxLeft + listboxWidth;
	listboxBottom = listboxTop + listboxHeight;

	commentLeft = savepicLeft;
	commentTop = savepicTop + savepicHeight + 16;
	commentWidth = savepicWidth;
	commentHeight = (51+(screen->GetHeight()>200?10:0))*CleanYfac;
	commentRight = commentLeft + commentWidth;
	commentBottom = commentTop + commentHeight;
}